

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Svd.h
# Opt level: O2

double __thiscall
singular::Svd<60,_50>::BidiagonalMatrix::applyFirstRotatorFromRight
          (BidiagonalMatrix *this,Rotator *r)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pdVar3 = this->pBlock;
  dVar1 = pdVar3[2];
  dVar4 = r->elements[1];
  dVar5 = r->elements[2];
  dVar6 = r->elements[3];
  dVar2 = *pdVar3;
  *pdVar3 = dVar2 * r->elements[0] + pdVar3[1] * dVar5;
  pdVar3[1] = dVar2 * dVar4 + pdVar3[1] * dVar6;
  pdVar3[2] = dVar6 * dVar1;
  return dVar1 * dVar5;
}

Assistant:

double applyFirstRotatorFromRight(const Rotator& r) {
				double b1 = this->pBlock[0];
				double g1 = this->pBlock[1];
				double b2 = this->pBlock[2];
				double r11 = r(0, 0);
				double r12 = r(0, 1);
				double r21 = r(1, 0);
				double r22 = r(1, 1);
				this->pBlock[0] = b1 * r11 + g1 * r21;
				this->pBlock[1] = b1 * r12 + g1 * r22;
				this->pBlock[2] = b2 * r22;
				return b2 * r21;
			}